

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O3

void __thiscall psy::C::ParserTester::case0283(ParserTester *this)

{
  Expectation X;
  ParseOptions parseOpts;
  Expectation *pEVar1;
  LanguageExtensions *pLVar2;
  string *psVar3;
  initializer_list<psy::C::SyntaxKind> __l;
  undefined8 in_stack_fffffffffffffde8;
  pointer in_stack_fffffffffffffdf0;
  pointer in_stack_fffffffffffffdf8;
  pointer in_stack_fffffffffffffe00;
  undefined1 *puVar4;
  undefined8 in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe18;
  undefined1 auVar5 [32];
  undefined1 in_stack_fffffffffffffe20 [120];
  _Alloc_hider in_stack_fffffffffffffe98;
  size_type in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeb0 [16];
  pointer local_140;
  pointer local_130;
  vector<psy::C::Decl,_std::allocator<psy::C::Decl>_> local_128;
  pointer local_108;
  pointer local_f8;
  Expectation local_f0;
  SyntaxKind local_38 [20];
  
  puVar4 = &stack0xfffffffffffffe18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffe08,"void x ( y , z ) int y ; int z ; { }","");
  Expectation::Expectation((Expectation *)&stack0xfffffffffffffe58);
  local_38[8] = ParameterDeclaration;
  local_38[9] = IdentifierDeclarator;
  local_38[10] = ExtKR_ParameterDeclaration;
  local_38[0xb] = BasicTypeSpecifier;
  local_38[0xc] = IdentifierDeclarator;
  local_38[0xd] = ExtKR_ParameterDeclaration;
  local_38[0xe] = BasicTypeSpecifier;
  local_38[0xf] = IdentifierDeclarator;
  local_38[0] = STARTof_Node;
  local_38[1] = FunctionDefinition;
  local_38[2] = VoidTypeSpecifier;
  local_38[3] = FunctionDeclarator;
  local_38[4] = IdentifierDeclarator;
  local_38[5] = ParameterSuffix;
  local_38[6] = ParameterDeclaration;
  local_38[7] = IdentifierDeclarator;
  local_38[0x10] = 0x469;
  __l._M_len = 0x11;
  __l._M_array = local_38;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
             &stack0xfffffffffffffdf0,__l,(allocator_type *)&stack0xfffffffffffffdef);
  pEVar1 = Expectation::AST((Expectation *)&stack0xfffffffffffffe58,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &stack0xfffffffffffffdf0);
  Expectation::Expectation(&local_f0,pEVar1);
  ParseOptions::ParseOptions((ParseOptions *)&stack0xfffffffffffffe38);
  LanguageExtensions::LanguageExtensions((LanguageExtensions *)&stack0xfffffffffffffe28);
  pLVar2 = LanguageExtensions::enable_extC_KandRStyle
                     ((LanguageExtensions *)&stack0xfffffffffffffe28,true);
  psVar3 = (string *)
           ParseOptions::withLanguageExtensions((ParseOptions *)&stack0xfffffffffffffe38,*pLVar2);
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdf0;
  X.numE_ = (int)in_stack_fffffffffffffde8;
  X.numW_ = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdf8;
  X.descriptorsE_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe00;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar4;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe10;
  X.descriptorsW_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffe18;
  auVar5 = in_stack_fffffffffffffe20._8_32_;
  X.continueTestDespiteOfErrors_ = (bool)in_stack_fffffffffffffe20[0];
  X.containsAmbiguity_ = (bool)in_stack_fffffffffffffe20[1];
  X._58_6_ = in_stack_fffffffffffffe20._2_6_;
  X.ambiguityText_._M_dataplus._M_p = (pointer)auVar5._0_8_;
  X.ambiguityText_._M_string_length = auVar5._8_8_;
  X.ambiguityText_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar5._16_16_;
  X.unfinishedParse_ = (bool)in_stack_fffffffffffffe20[0x28];
  X._97_7_ = in_stack_fffffffffffffe20._41_7_;
  X.syntaxKinds_.super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl
  .super__Vector_impl_data =
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       (_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>)
       in_stack_fffffffffffffe20._48_24_;
  X.declarations_.super__Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)
       (_Vector_base<psy::C::Decl,_std::allocator<psy::C::Decl>_>)in_stack_fffffffffffffe20._72_24_;
  X.checkScope_ = (bool)in_stack_fffffffffffffe20[0x60];
  X._153_7_ = in_stack_fffffffffffffe20._97_7_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_fffffffffffffe20._104_8_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_fffffffffffffe20._112_8_;
  X.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffe98._M_p;
  parseOpts.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)in_stack_fffffffffffffea8;
  parseOpts._0_8_ = in_stack_fffffffffffffea0;
  parseOpts.langExts_.field_1 =
       (anon_union_8_2_2d0bec1f_for_LanguageExtensions_1)in_stack_fffffffffffffeb0._0_8_;
  parseOpts.field_2 = (anon_union_2_2_312b2e7f_for_ParseOptions_2)in_stack_fffffffffffffeb0._8_2_;
  parseOpts._26_6_ = in_stack_fffffffffffffeb0._10_6_;
  parse(this,*psVar3,X,(SyntaxCategory)&stack0xfffffffffffffe08,parseOpts);
  if (local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.scopePath_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_f0.declarations_);
  if (local_f0.syntaxKinds_.
      super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.syntaxKinds_.
                    super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.syntaxKinds_.
                          super__Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.ambiguityText_._M_dataplus._M_p != &local_f0.ambiguityText_.field_2) {
    operator_delete(local_f0.ambiguityText_._M_dataplus._M_p,
                    local_f0.ambiguityText_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.descriptorsW_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.descriptorsE_);
  if (in_stack_fffffffffffffdf0 != (pointer)0x0) {
    operator_delete(in_stack_fffffffffffffdf0,
                    (long)in_stack_fffffffffffffe00 - (long)in_stack_fffffffffffffdf0);
  }
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::~vector(&local_128);
  if (local_140 != (pointer)0x0) {
    operator_delete(local_140,(long)local_130 - (long)local_140);
  }
  if (in_stack_fffffffffffffe98._M_p != &stack0xfffffffffffffea8) {
    operator_delete(in_stack_fffffffffffffe98._M_p,in_stack_fffffffffffffea8 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe60);
  if (puVar4 != &stack0xfffffffffffffe18) {
    operator_delete(puVar4,in_stack_fffffffffffffe18 + 1);
  }
  return;
}

Assistant:

void ParserTester::case0283()
{
    parse("void x ( y , z ) int y ; int z ; { }",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::FunctionDefinition,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ExtKR_ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::CompoundStatement }),
          SyntaxTree::SyntaxCategory::Any,
          ParseOptions().withLanguageExtensions(
              LanguageExtensions().enable_extC_KandRStyle(true)));
}